

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::RgbaInputFile::setFrameBuffer(RgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  size_t xst;
  size_t yst;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  FrameBuffer *in_stack_000000b8;
  InputFile *in_stack_000000c0;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  Lock lock;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe0c;
  Lock *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string local_1a8 [32];
  Slice local_188;
  string local_150 [32];
  Slice local_130;
  string local_f8 [32];
  Slice local_d8;
  string local_a0 [80];
  string *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  Rgba *in_stack_ffffffffffffffc8;
  FromYca *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    xst = in_RDX << 3;
    yst = in_RCX << 3;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x2465ef);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_d8,HALF,in_RSI,xst,yst,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_a0);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_130,HALF,in_RSI + 2,xst,yst,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_f8);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_188,HALF,in_RSI + 4,xst,yst,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_150);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice((Slice *)&stack0xfffffffffffffe20,HALF,in_RSI + 6,xst,yst,1,1,1.0,false,false);
    FrameBuffer::insert((FrameBuffer *)in_stack_fffffffffffffe10,
                        (string *)CONCAT44(in_stack_fffffffffffffe0c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe04,uVar1));
    std::__cxx11::string::~string(local_1a8);
    InputFile::setFrameBuffer(in_stack_000000c0,in_stack_000000b8);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x24686a);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffe10,
               (Mutex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               SUB41((uint)in_stack_fffffffffffffe04 >> 0x18,0));
    FromYca::setFrameBuffer
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  return;
}

Assistant:

void	
RgbaInputFile::setFrameBuffer (Rgba *base, size_t xStride, size_t yStride)
{
    if (_fromYca)
    {
	Lock lock (*_fromYca);
	_fromYca->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
	size_t xs = xStride * sizeof (Rgba);
	size_t ys = yStride * sizeof (Rgba);

	FrameBuffer fb;

	fb.insert (_channelNamePrefix + "R",
		   Slice (HALF,
			  (char *) &base[0].r,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "G",
		   Slice (HALF,
			  (char *) &base[0].g,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "B",
		   Slice (HALF,
			  (char *) &base[0].b,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "A",
		   Slice (HALF,
			  (char *) &base[0].a,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  1.0));	// fillValue

	_inputFile->setFrameBuffer (fb);
    }
}